

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.cpp
# Opt level: O2

pid_t __thiscall TuxProc::Process::attach(Process *this,char *processName)

{
  int iVar1;
  pid_t pVar2;
  DIR *__dirp;
  dirent *pdVar3;
  ulong uVar4;
  ssize_t sVar5;
  char *__s1;
  char *error;
  char symbolicPath [128];
  char truePath [4096];
  
  this->processID = 0;
  __dirp = opendir("/proc");
  if (__dirp == (DIR *)0x0) {
    pVar2 = this->processID;
  }
  else {
    do {
      do {
        do {
          pdVar3 = readdir(__dirp);
          if (pdVar3 == (dirent *)0x0) goto LAB_001025dd;
          uVar4 = strtol(pdVar3->d_name,&error,10);
        } while (((int)uVar4 == 0) || (*error != '\0'));
        snprintf(symbolicPath,0x80,"/proc/%u/exe",uVar4 & 0xffffffff);
        sVar5 = readlink(symbolicPath,truePath,0x1000);
      } while (sVar5 == 0);
      truePath[sVar5] = '\0';
      __s1 = __xpg_basename(truePath);
      iVar1 = strcmp(__s1,processName);
    } while (iVar1 != 0);
    this->processID = (int)uVar4;
LAB_001025dd:
    closedir(__dirp);
    pVar2 = this->processID;
  }
  return pVar2;
}

Assistant:

pid_t Process::attach(const char* processName)
{
    // ** search processes for one with processName by inspecting each /proc/<uid>/exe path

    // open proc directory
    processID = 0;
    DIR* procDirectory = opendir("/proc");
    if (!procDirectory) {
        return processID;
    }

    // parse directory files
    char* error;
    struct dirent* entry;
    while ((entry = readdir(procDirectory))) {
        // name of file is the pid
        uint32_t id = strtol(entry->d_name, &error, 10);
        if (id == 0 || *error != 0) {
            continue;
        }
        char symbolicPath[128];
        char truePath[FILENAME_MAX];

        // resolve path of exe symlink
        snprintf(symbolicPath, sizeof(symbolicPath), "/proc/%u/exe", id);
        size_t pathLength = readlink(symbolicPath, truePath, sizeof(truePath));
        if (pathLength > 0) {
            truePath[pathLength] = 0;
            // check if executable name matches supplied processName
            const char* szFileName = basename(truePath);
            if (strcmp(szFileName, processName) == 0) {
                processID = id;
                break;
            }
        }
    }
    closedir(procDirectory);
    return processID;
}